

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O1

void __thiscall VectorDouble::appendValue(VectorDouble *this,double l)

{
  ulong uVar1;
  unsigned_long uVar2;
  double *pdVar3;
  ulong uVar4;
  
  uVar1 = this->vaLength;
  if (this->vLength == uVar1) {
    uVar4 = uVar1 >> 3;
    if ((long)(uVar1 >> 3) < vDefaultBoost) {
      uVar4 = vDefaultBoost;
    }
    this->vaLength = uVar4 + uVar1;
    pdVar3 = (double *)realloc(this->vData,(uVar4 + uVar1) * 8);
    this->vData = pdVar3;
  }
  uVar2 = this->vLength;
  this->vLength = uVar2 + 1;
  this->vData[uVar2] = l;
  return;
}

Assistant:

void VectorDouble::appendValue(const double l) {
  long addThis;
  if (vLength == vaLength) {
    addThis = vaLength / 8;
    if (VectorDouble::vDefaultBoost > addThis)
      addThis = VectorDouble::vDefaultBoost;
    vaLength += addThis;
    vData = (double *)realloc(vData, sizeof(double) * vaLength);
  }
  vData[vLength++] = l;
}